

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

void __thiscall amrex::AmrLevel::constructAreaNotToTag(AmrLevel *this)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Amr *pAVar5;
  pointer pIVar6;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var7;
  ulong uVar8;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *pVVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  BoxArray *pBVar13;
  int iVar14;
  BoxArray *pBVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  byte bVar23;
  BoxArray tagba;
  BoxArray bxa;
  BoxArray local_120;
  Box local_b8;
  BoxArray local_98;
  
  bVar23 = 0;
  iVar2 = this->level;
  if (((iVar2 != 0) &&
      (pAVar5 = this->parent,
      (pAVar5->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_coarse_grids == true)) &&
     (iVar19 = (pAVar5->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_upto_level,
     iVar19 <= iVar2)) {
    if (iVar19 == iVar2) {
      pVVar9 = Amr::getInitialBA(pAVar5);
      BoxArray::minimalBox
                (&local_b8,
                 (pVVar9->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)this->level + -1);
      pAVar5 = this->parent;
      iVar2 = this->level;
      pIVar6 = (pAVar5->super_AmrCore).super_AmrMesh.super_AmrInfo.blocking_factor.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar19 = pIVar6[iVar2].vect[0];
      uVar1 = *(undefined8 *)(pIVar6[iVar2].vect + 1);
      iVar17 = (int)((ulong)uVar1 >> 0x20);
      iVar18 = (int)uVar1;
      local_b8.smallend.vect[0] = iVar19 + local_b8.smallend.vect[0];
      local_b8.smallend.vect[1] = iVar18 + local_b8.smallend.vect[1];
      local_b8.smallend.vect[2] = iVar17 + local_b8.smallend.vect[2];
      local_b8.bigend.vect[0] = local_b8.bigend.vect[0] - iVar19;
      local_b8.bigend.vect[1] = local_b8.bigend.vect[1] - iVar18;
      local_b8.bigend.vect[2] = local_b8.bigend.vect[2] - iVar17;
      *(ulong *)(this->m_AreaToTag).bigend.vect =
           CONCAT44(local_b8.bigend.vect[1],local_b8.bigend.vect[0]);
      *(ulong *)((this->m_AreaToTag).bigend.vect + 2) =
           CONCAT44(local_b8.btype.itype,local_b8.bigend.vect[2]);
      *(ulong *)(this->m_AreaToTag).smallend.vect =
           CONCAT44(local_b8.smallend.vect[1],local_b8.smallend.vect[0]);
      *(ulong *)((this->m_AreaToTag).smallend.vect + 2) =
           CONCAT44(local_b8.bigend.vect[0],local_b8.smallend.vect[2]);
      boxComplement(&local_120,
                    &(pAVar5->super_AmrCore).super_AmrMesh.geom.
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar2].domain,&this->m_AreaToTag);
      pBVar13 = &local_120;
      pBVar15 = &this->m_AreaNotToTag;
      for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
        *(undefined8 *)&pBVar15->m_bat = *(undefined8 *)&pBVar13->m_bat;
        pBVar13 = (BoxArray *)((long)pBVar13 + (ulong)bVar23 * -0x10 + 8);
        pBVar15 = (BoxArray *)((long)pBVar15 + (ulong)bVar23 * -0x10 + 8);
      }
      (this->m_AreaNotToTag).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_120.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_AreaNotToTag).m_ref.
                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_120.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      (this->m_AreaNotToTag).m_simplified_list.
      super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_120.m_simplified_list.
           super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_AreaNotToTag).m_simplified_list.
                  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_120.m_simplified_list.
                  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      BoxArray::BoxArray(&local_98,
                         &(this->parent->super_AmrCore).super_AmrMesh.geom.
                          super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          _M_impl.super__Vector_impl_data._M_start[this->level].domain);
      BoxArray::~BoxArray(&local_98);
      BoxArray::~BoxArray(&local_120);
    }
    pAVar5 = this->parent;
    iVar2 = this->level;
    if ((pAVar5->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_upto_level < iVar2) {
      pIVar6 = (pAVar5->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start;
      _Var7.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (pAVar5->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)iVar2 + -1]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      iVar19 = *(int *)((long)_Var7.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x1f0)
      ;
      iVar18 = *(int *)((long)_Var7.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 500);
      iVar17 = *(int *)((long)_Var7.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x1f8)
      ;
      iVar16 = *(int *)((long)_Var7.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x1fc)
      ;
      iVar14 = *(int *)((long)_Var7.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x200)
      ;
      iVar11 = *(int *)((long)_Var7.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x204)
      ;
      uVar3 = *(uint *)((long)_Var7.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x208)
      ;
      uVar8 = *(ulong *)pIVar6[(long)iVar2 + -1].vect;
      iVar4 = pIVar6[(long)iVar2 + -1].vect[2];
      iVar21 = (int)uVar8;
      if ((iVar4 != 1 || iVar21 != 1) || uVar8 >> 0x20 != 1) {
        iVar19 = iVar19 * iVar21;
        iVar22 = (int)(uVar8 >> 0x20);
        iVar18 = iVar18 * iVar22;
        iVar17 = iVar17 * iVar4;
        uVar20 = (uint)((uVar3 & 2) == 0);
        uVar12 = (uint)((uVar3 & 4) == 0);
        iVar16 = (iVar16 + (~uVar3 & 1)) * iVar21 - (~uVar3 & 1);
        iVar14 = (iVar14 + uVar20) * iVar22 - uVar20;
        iVar11 = (iVar11 + uVar12) * iVar4 - uVar12;
      }
      pIVar6 = (pAVar5->super_AmrCore).super_AmrMesh.super_AmrInfo.blocking_factor.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = pIVar6[iVar2].vect[0];
      iVar21 = pIVar6[iVar2].vect[1];
      iVar22 = pIVar6[iVar2].vect[2];
      (this->m_AreaToTag).smallend.vect[0] = iVar19 + iVar4;
      (this->m_AreaToTag).smallend.vect[1] = iVar18 + iVar21;
      (this->m_AreaToTag).smallend.vect[2] = iVar17 + iVar22;
      (this->m_AreaToTag).bigend.vect[0] = iVar16 - iVar4;
      (this->m_AreaToTag).bigend.vect[1] = iVar14 - iVar21;
      (this->m_AreaToTag).bigend.vect[2] = iVar11 - iVar22;
      (this->m_AreaToTag).btype.itype = uVar3;
      boxComplement(&local_120,
                    &(pAVar5->super_AmrCore).super_AmrMesh.geom.
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar2].domain,&this->m_AreaToTag);
      pBVar13 = &local_120;
      pBVar15 = &this->m_AreaNotToTag;
      for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
        *(undefined8 *)&pBVar15->m_bat = *(undefined8 *)&pBVar13->m_bat;
        pBVar13 = (BoxArray *)((long)pBVar13 + (ulong)bVar23 * -0x10 + 8);
        pBVar15 = (BoxArray *)((long)pBVar15 + (ulong)bVar23 * -0x10 + 8);
      }
      (this->m_AreaNotToTag).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_120.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_AreaNotToTag).m_ref.
                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_120.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      (this->m_AreaNotToTag).m_simplified_list.
      super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_120.m_simplified_list.
           super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_AreaNotToTag).m_simplified_list.
                  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_120.m_simplified_list.
                  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      BoxArray::~BoxArray(&local_120);
    }
  }
  return;
}

Assistant:

void AmrLevel::constructAreaNotToTag ()
{
    if (level == 0 || !parent->useFixedCoarseGrids() || parent->useFixedUpToLevel()>level)
        return;

    // We are restricting the tagging on the finest fixed level
    if (parent->useFixedUpToLevel()==level)
    {
        // We use the next coarser level shrunk by one blockingfactor
        //    as the region in which we allow tagging.
        // Why level-1? Because we always use the full domain at level 0
        //    and therefore level 0 in initialba is level 1 in the AMR hierarchy, etc.
        const Vector<BoxArray>& initialba = parent->getInitialBA();
        Box tagarea(initialba[level-1].minimalBox());
        tagarea.grow(-parent->blockingFactor(level));
        m_AreaToTag = tagarea;

        // We disallow tagging in the remaining part of the domain.
        BoxArray tagba = amrex::boxComplement(parent->Geom(level).Domain(),m_AreaToTag);
        m_AreaNotToTag = tagba;

        BoxArray bxa(parent->Geom(level).Domain());
        BL_ASSERT(bxa.contains(m_AreaNotToTag));
    }

    if (parent->useFixedUpToLevel()<level)
    {
        Box tagarea = parent->getLevel(level-1).getAreaToTag();
        tagarea.refine(parent->refRatio(level-1));
        tagarea.grow(-parent->blockingFactor(level));
        m_AreaToTag = tagarea;
        BoxArray tagba = amrex::boxComplement(parent->Geom(level).Domain(),m_AreaToTag);
        m_AreaNotToTag = tagba;
    }
}